

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall SummedArea_Randoms_Test::TestBody(SummedArea_Randoms_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Allocator alloc;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  Array2D<float> *values;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *message;
  uint uVar13;
  uint64_t oldstate;
  ulong uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  Float FVar17;
  undefined1 auVar18 [16];
  string ret;
  AssertionResult gtest_ar;
  double s;
  Bounds2f bf;
  SummedAreaTable sat;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  double local_e0;
  int local_d4;
  string local_d0;
  Array2D<float> local_b0;
  int local_8c;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78;
  AssertHelper local_70;
  double local_68;
  undefined1 local_60 [48];
  float *__s;
  
  uVar14 = 0x853c49e6748fea9b;
  local_78 = 0;
  do {
    uVar7 = *(ulong *)((long)&DAT_005729a0 + local_78);
    local_b0.allocator.memoryResource = pstd::pmr::new_delete_resource();
    uVar8 = (uint)uVar7;
    local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar8 >> 0x1f & uVar8;
    uVar10 = (uint)(uVar7 >> 0x20);
    uVar9 = 0;
    if (0 < (int)uVar8) {
      uVar9 = uVar7 & 0xffffffff;
    }
    uVar12 = 0;
    if (uVar10 != 0 && -1 < (long)uVar7) {
      uVar12 = (ulong)uVar10;
    }
    local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int> =
         (Tuple2<pbrt::Point2,_int>)(uVar9 | uVar12 << 0x20);
    local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar10 >> 0x1f & uVar10;
    uVar11 = -uVar8;
    if (0 < (int)uVar8) {
      uVar11 = uVar8;
    }
    uVar8 = -uVar10;
    if (0 < (int)uVar10) {
      uVar8 = uVar10;
    }
    uVar8 = uVar8 * uVar11;
    if (uVar8 == 0) {
      __s = (float *)0x0;
    }
    else {
      iVar5 = (*(local_b0.allocator.memoryResource)->_vptr_memory_resource[2])
                        (local_b0.allocator.memoryResource,(ulong)uVar8 * 4,4);
      __s = (float *)CONCAT44(extraout_var,iVar5);
    }
    local_b0.values = __s;
    if (0 < (int)uVar8) {
      memset(__s,0,(ulong)uVar8 << 2);
    }
    if (local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y <
        local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y) {
      uVar10 = local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
               local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      iVar5 = 0;
      do {
        if (0 < (int)uVar10) {
          uVar9 = 0;
          uVar7 = uVar14;
          do {
            do {
              uVar14 = uVar7 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              uVar8 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
              bVar6 = (byte)(uVar7 >> 0x3b);
              uVar8 = uVar8 >> bVar6 | uVar8 << 0x20 - bVar6;
              uVar7 = uVar14;
            } while ((int)uVar8 < 0);
            __s[(int)(((int)uVar9 - local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) +
                     (iVar5 - local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar10)] =
                 (float)((int)uVar8 % 0x20);
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar10);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                        local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    values = &local_b0;
    pbrt::SummedAreaTable::SummedAreaTable((SummedAreaTable *)(local_60 + 0x10),values,alloc);
    iVar5 = 0;
    do {
      local_d4 = iVar5;
      local_8c = local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      uVar10 = local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
               local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      uVar8 = -uVar10 % uVar10;
      do {
        uVar11 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
        bVar6 = (byte)(uVar14 >> 0x3b);
        uVar11 = uVar11 >> bVar6 | uVar11 << 0x20 - bVar6;
        if ((int)uVar8 <= (int)uVar11) {
          values = (Array2D<float> *)((long)(int)uVar11 % (long)(int)uVar10 & 0xffffffff);
        }
        uVar14 = uVar14 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar11 < (int)uVar8);
      uVar15 = local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
               local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      uVar7 = (ulong)-uVar15 % (ulong)uVar15;
      do {
        uVar13 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
        bVar6 = (byte)(uVar14 >> 0x3b);
        uVar13 = uVar13 >> bVar6 | uVar13 << 0x20 - bVar6;
        uVar9 = (ulong)uVar13;
        iVar5 = (int)((ulong)-uVar15 % (ulong)uVar15);
        if (iVar5 <= (int)uVar13) {
          uVar7 = (long)(int)uVar13 % (long)(int)uVar15 & 0xffffffff;
          uVar11 = (uint)((long)(int)uVar13 % (long)(int)uVar15);
        }
        uVar14 = uVar14 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar13 < iVar5);
      do {
        uVar13 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
        bVar6 = (byte)(uVar14 >> 0x3b);
        uVar13 = uVar13 >> bVar6 | uVar13 << 0x20 - bVar6;
        if ((int)uVar8 <= (int)uVar13) {
          uVar7 = (long)(int)uVar13 % (long)(int)uVar10 & 0xffffffff;
          uVar9 = (long)(int)uVar13 % (long)(int)uVar10 & 0xffffffff;
        }
        uVar14 = uVar14 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar13 < (int)uVar8);
      do {
        uVar8 = (uint)(uVar14 >> 0x2d) ^ (uint)(uVar14 >> 0x1b);
        bVar6 = (byte)(uVar14 >> 0x3b);
        uVar8 = uVar8 >> bVar6 | uVar8 << 0x20 - bVar6;
        if (iVar5 <= (int)uVar8) {
          uVar7 = (long)(int)uVar8 % (long)(int)uVar15 & 0xffffffff;
        }
        uVar14 = uVar14 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar8 < iVar5);
      auVar16 = vpinsrd_avx(ZEXT416((uint)uVar9),(uint)uVar7,1);
      auVar18 = vpinsrd_avx(ZEXT416((uint)values),uVar11,1);
      auVar3 = vpminsd_avx(auVar16,auVar18);
      uVar8 = auVar3._0_4_;
      auVar2 = vpmaxsd_avx(auVar18,auVar16);
      auVar16 = vpinsrd_avx(ZEXT416(uVar10),uVar15,1);
      auVar16 = vcvtdq2ps_avx(auVar16);
      auVar18 = vcvtdq2ps_avx(auVar3);
      auVar1 = vdivps_avx(auVar18,auVar16);
      auVar18 = vcvtdq2ps_avx(auVar2);
      auVar16 = vdivps_avx(auVar18,auVar16);
      auVar18 = vminps_avx(auVar16,auVar1);
      auVar16 = vmaxps_avx(auVar16,auVar1);
      local_60._0_16_ = vmovlhps_avx(auVar18,auVar16);
      local_e0 = 0.0;
      if (((int)uVar8 < (int)auVar2._0_4_) && (uVar11 != (uint)uVar7)) {
        uVar12 = (ulong)auVar3._4_4_;
        local_e0 = 0.0;
        uVar7 = (ulong)uVar8;
        uVar9 = auVar3._0_8_;
        do {
          local_e0 = local_e0 +
                     (double)local_b0.values
                             [(int)(((int)uVar12 -
                                    local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar10
                                   + ((int)uVar7 -
                                     local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x))];
          uVar11 = (int)uVar7 + 1;
          uVar7 = (uVar9 & 0xffffffff00000000) + (ulong)uVar8 + 0x100000000;
          if (uVar11 != auVar2._0_4_) {
            uVar7 = (ulong)uVar11 | uVar9 & 0xffffffff00000000;
          }
          uVar12 = uVar7 >> 0x20;
          uVar9 = uVar7;
        } while ((uVar8 != (uint)uVar7) || (auVar2._4_4_ != (int)(uVar7 >> 0x20)));
      }
      local_e0 = local_e0 / (double)(int)(uVar15 * uVar10);
      values = (Array2D<float> *)local_60;
      FVar17 = pbrt::SummedAreaTable::Integral
                         ((SummedAreaTable *)(local_60 + 0x10),(Bounds2f *)values);
      local_68 = (double)FVar17;
      if ((local_e0 != local_68) || (NAN(local_e0) || NAN(local_68))) {
        auVar18._0_8_ = (local_e0 - local_68) / local_e0;
        auVar18._8_8_ = 0;
        auVar16._8_8_ = 0x7fffffffffffffff;
        auVar16._0_8_ = 0x7fffffffffffffff;
        auVar16 = vandpd_avx512vl(auVar18,auVar16);
        local_d0._M_dataplus._M_p = (pointer)vmovlpd_avx(auVar16);
        local_e8.ptr_._0_4_ = 0x3a83126f;
        testing::internal::CmpHelperLT<double,float>
                  (local_88,"std::abs((ref - s) / ref)","1e-3f",(double *)&local_d0,
                   (float *)&local_e8);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_e8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          pbrt::detail::stringPrintfRecursive<double&,double&>
                    (&local_d0,"ref %f s %f",&local_e0,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_e8.ptr_ + 0x10),local_d0._M_dataplus._M_p,
                     local_d0._M_string_length);
          message = "";
          if (local_80.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = ((local_80.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                     ,0x51d,message);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          if (local_e8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_e8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_e8.ptr_ + 8))();
            }
            local_e8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        values = (Array2D<float> *)0x0;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      iVar5 = local_d4 + 1;
    } while (local_d4 + 1 != 100);
    pbrt::Array2D<double>::~Array2D((Array2D<double> *)(local_60 + 0x10));
    pbrt::Array2D<float>::~Array2D(&local_b0);
    local_78 = local_78 + 8;
  } while (local_78 != 0x30);
  return;
}

Assistant:

TEST(SummedArea, Randoms) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        for (int i = 0; i < 100; ++i) {
            Bounds2i bi({rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())},
                        {rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())});
            Bounds2f bf(Point2f(Float(bi.pMin.x) / Float(v.xSize()),
                                Float(bi.pMin.y) / Float(v.ySize())),
                        Point2f(Float(bi.pMax.x) / Float(v.xSize()),
                                Float(bi.pMax.y) / Float(v.ySize())));
            double ref = 0;

            for (Point2i p : bi)
                ref += v[p];
            ref /= v.xSize() * v.ySize();

            double s = sat.Integral(bf);
            if (ref != s)
                EXPECT_LT(std::abs((ref - s) / ref), 1e-3f)
                    << StringPrintf("ref %f s %f", ref, s);
        }
    }
}